

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O0

int lj_cf_buffer_method_reset(lua_State *L)

{
  SBufExt *pSVar1;
  SBufExt *sbx;
  lua_State *L_local;
  
  pSVar1 = buffer_tobuf(L);
  if (((pSVar1->L).ptr64 & 2) != 0) {
    (pSVar1->L).ptr64 = (pSVar1->L).ptr64 & 0xfffffffffffffffd;
    pSVar1->field_4 = (anon_union_8_2_d9f1b0d6_for_SBufExt_4)0x0;
    pSVar1->e = (char *)0x0;
    pSVar1->b = (char *)0x0;
  }
  pSVar1->w = pSVar1->b;
  pSVar1->r = pSVar1->b;
  L->top = L->base + 1;
  return 1;
}

Assistant:

LJLIB_CF(buffer_method_reset)		LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobuf(L);
  lj_bufx_reset(sbx);
  L->top = L->base+1;  /* Chain buffer object. */
  return 1;
}